

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::set_current_block
          (AnalyzeVariableScopeAccessHandler *this,SPIRBlock *block)

{
  int iVar1;
  size_t sVar2;
  Case *pCVar3;
  uint32_t to;
  long lVar4;
  anon_class_16_2_f791057a test_phi;
  anon_class_16_2_f791057a local_38;
  
  this->current_block = block;
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  local_38.this = this;
  local_38.block = block;
  if (iVar1 == 3) {
    notify_variable_access(this,(block->condition).id,(block->super_IVariant).self.id);
    sVar2 = (block->cases).super_VectorView<spirv_cross::SPIRBlock::Case>.buffer_size;
    if (sVar2 != 0) {
      pCVar3 = (block->cases).super_VectorView<spirv_cross::SPIRBlock::Case>.ptr;
      lVar4 = 0;
      do {
        set_current_block::anon_class_16_2_f791057a::operator()
                  (&local_38,*(uint32_t *)((long)&(pCVar3->block).id + lVar4));
        lVar4 = lVar4 + 8;
      } while (sVar2 << 3 != lVar4);
    }
    to = (block->default_block).id;
    if (to == 0) {
      return;
    }
  }
  else if (iVar1 == 2) {
    notify_variable_access(this,(block->condition).id,(block->super_IVariant).self.id);
    set_current_block::anon_class_16_2_f791057a::operator()(&local_38,(block->true_block).id);
    to = (block->false_block).id;
  }
  else {
    if (iVar1 != 1) {
      return;
    }
    notify_variable_access(this,(block->condition).id,(block->super_IVariant).self.id);
    to = (block->next_block).id;
  }
  set_current_block::anon_class_16_2_f791057a::operator()(&local_38,to);
  return;
}

Assistant:

void Compiler::AnalyzeVariableScopeAccessHandler::set_current_block(const SPIRBlock &block)
{
	current_block = &block;

	// If we're branching to a block which uses OpPhi, in GLSL
	// this will be a variable write when we branch,
	// so we need to track access to these variables as well to
	// have a complete picture.
	const auto test_phi = [this, &block](uint32_t to) {
		auto &next = compiler.get<SPIRBlock>(to);
		for (auto &phi : next.phi_variables)
		{
			if (phi.parent == block.self)
			{
				accessed_variables_to_block[phi.function_variable].insert(block.self);
				// Phi variables are also accessed in our target branch block.
				accessed_variables_to_block[phi.function_variable].insert(next.self);

				notify_variable_access(phi.local_variable, block.self);
			}
		}
	};

	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		notify_variable_access(block.condition, block.self);
		test_phi(block.next_block);
		break;

	case SPIRBlock::Select:
		notify_variable_access(block.condition, block.self);
		test_phi(block.true_block);
		test_phi(block.false_block);
		break;

	case SPIRBlock::MultiSelect:
		notify_variable_access(block.condition, block.self);
		for (auto &target : block.cases)
			test_phi(target.block);
		if (block.default_block)
			test_phi(block.default_block);
		break;

	default:
		break;
	}
}